

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

int __thiscall
Fl_Text_Display::position_to_linecol(Fl_Text_Display *this,int pos,int *lineNum,int *column)

{
  Fl_Text_Buffer *this_00;
  int iVar1;
  int iVar2;
  
  if (this->mContinuousWrap == 0) {
    iVar2 = position_to_line(this,pos,lineNum);
    if (iVar2 != 0) {
      iVar1 = Fl_Text_Buffer::count_displayed_characters
                        (this->mBuffer,this->mLineStarts[*lineNum],pos);
      *column = iVar1;
      *lineNum = *lineNum + this->mTopLineNum;
    }
  }
  else {
    iVar2 = 0;
    if (((this->mNeedAbsTopLineNum != 0 || this->mLineNumWidth != 0) &&
        (iVar2 = 0, this->mFirstChar <= pos)) && (pos <= this->mLastChar)) {
      iVar2 = this->mAbsTopLineNum;
      iVar1 = Fl_Text_Buffer::count_lines(this->mBuffer,this->mFirstChar,pos);
      *lineNum = iVar1 + iVar2;
      this_00 = this->mBuffer;
      iVar2 = Fl_Text_Buffer::line_start(this_00,pos);
      iVar2 = Fl_Text_Buffer::count_displayed_characters(this_00,iVar2,pos);
      *column = iVar2;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int Fl_Text_Display::position_to_linecol( int pos, int* lineNum, int* column ) const {
  IS_UTF8_ALIGNED2(buffer(), pos)

  int retVal;

  /* In continuous wrap mode, the absolute (non-wrapped) line count is
   maintained separately, as needed.  Only return it if we're actually
   keeping track of it and pos is in the displayed text */
  if (mContinuousWrap) {
    if (!maintaining_absolute_top_line_number() || pos < mFirstChar || pos > mLastChar)
      return 0;
    *lineNum = mAbsTopLineNum + buffer()->count_lines(mFirstChar, pos);
    *column = buffer()->count_displayed_characters(buffer()->line_start(pos), pos);
    return 1;
  }

  retVal = position_to_line( pos, lineNum );
  if ( retVal ) {
    *column = mBuffer->count_displayed_characters( mLineStarts[ *lineNum ], pos );
    *lineNum += mTopLineNum;
  }
  return retVal;
}